

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O0

void ABC_TargetResFree(CSAT_Target_ResultT *p)

{
  int local_14;
  int i;
  CSAT_Target_ResultT *p_local;
  
  if (p != (CSAT_Target_ResultT *)0x0) {
    if (p->names != (char **)0x0) {
      for (local_14 = 0; local_14 < p->no_sig; local_14 = local_14 + 1) {
        if (p->names[local_14] != (char *)0x0) {
          free(p->names[local_14]);
          p->names[local_14] = (char *)0x0;
        }
      }
    }
    if (p->names != (char **)0x0) {
      free(p->names);
      p->names = (char **)0x0;
    }
    if (p->values != (int *)0x0) {
      free(p->values);
      p->values = (int *)0x0;
    }
    if (p != (CSAT_Target_ResultT *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void ABC_TargetResFree( CSAT_Target_ResultT * p )
{
    if ( p == NULL )
        return;
    if( p->names )
    {
        int i = 0;
        for ( i = 0; i < p->no_sig; i++ )
        {
            ABC_FREE(p->names[i]);
        }
    }
    ABC_FREE( p->names );
    ABC_FREE( p->values );
    ABC_FREE( p );
}